

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebug::putTimeUnit(QDebug *this,qint64 num,qint64 den)

{
  Stream *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  QString *pQVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  qsizetype size;
  char *pcVar8;
  ulong uVar9;
  QString *pQVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  char unit [3];
  QByteArray local_80;
  QString local_68;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined2 local_38;
  long local_30;
  
  uVar1 = local_68.d.d._0_4_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->stream;
  if ((den < 2 || num != 1) ||
     (den == 10 ||
      den != 100 &&
      (den != 1000000000000000000 &&
      (den == 1000000000000000 ||
      (den == 1000000000000 || (den == 1000000000 || den != 1000000 && den != 1000)))))) {
    if (den == 1 && 1 < num) {
      uVar11 = (ulong)num / 0x1e18558;
      uVar6 = num;
      if (num == uVar11 * 0x1e18558) {
        uVar6 = uVar11;
      }
      pcVar8 = (char *)0x0;
      uVar9 = num;
      if (uVar6 == (uVar6 / 0x93a80) * 0x93a80) {
        pcVar8 = "wk";
        uVar9 = uVar6 / 0x93a80;
      }
      if (num == uVar11 * 0x1e18558) {
        uVar9 = uVar11;
        pcVar8 = "yr";
      }
      uVar6 = uVar9 / 0x15180;
      pQVar4 = (QString *)0x59558d;
      if (uVar9 % 0x15180 != 0 || (QString *)pcVar8 != (QString *)0x0) {
        uVar6 = uVar9;
        pQVar4 = (QString *)pcVar8;
      }
      uVar11 = uVar6 / 0xe10;
      pQVar10 = (QString *)0x5b4f9a;
      if (uVar6 % 0xe10 != 0 || pQVar4 != (QString *)0x0) {
        uVar11 = uVar6;
        pQVar10 = pQVar4;
      }
      pQVar4 = (QString *)"min";
      num = uVar11 / 0x3c;
      if (uVar11 % 0x3c != 0 || pQVar10 != (QString *)0x0) {
        pQVar4 = pQVar10;
        num = uVar11;
      }
    }
    else {
      pQVar4 = (QString *)0x0;
    }
    pQVar10 = (QString *)0x5affdc;
    if (pQVar4 != (QString *)0x0) {
      pQVar10 = pQVar4;
    }
    if ((den == 1) && (num == 1)) {
      size = -1;
    }
    else {
      if ((den < 1) || (num < 1)) {
        QString::asprintf((char **)&local_68,"<invalid time unit %lld/%lld>",num,den);
        QString::toLatin1_helper_inplace(&local_80,&local_68);
        putTimeUnit((QDebug *)&local_68);
        goto LAB_00223e94;
      }
      pcVar8 = (char *)((long)&local_68.d.d + 1);
      local_68.d.d._4_4_ = 0xaaaaaaaa;
      local_68.d.ptr._0_4_ = 0xaaaaaaaa;
      local_68.d.ptr._4_4_ = 0xaaaaaaaa;
      local_48 = 0xaaaaaaaa;
      uStack_44 = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_68.d.size._0_4_ = 0xaaaaaaaa;
      local_68.d.size._4_4_ = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      local_38 = 0xaaaa;
      local_68.d.d._0_4_ = 0xaaaaaa5b;
      if ((num < 10000) || (num != ((ulong)num / 1000) * 1000)) {
        iVar3 = snprintf(pcVar8,0x31,"%lld");
      }
      else {
        iVar3 = snprintf(pcVar8,0x31,"%.6g",SUB84((double)num,0));
      }
      lVar7 = (long)iVar3;
      if (den == 1) {
        lVar7 = lVar7 + 1;
      }
      else {
        pcVar8 = (char *)((long)&local_68.d.d + lVar7 + 2);
        *(undefined1 *)((long)&local_68.d.d + lVar7 + 1) = 0x2f;
        if ((den < 10000) || ((ulong)den % 1000 != 0)) {
          iVar3 = snprintf(pcVar8,0x30U - lVar7,"%lld",den);
        }
        else {
          iVar3 = snprintf(pcVar8,0x30U - lVar7,"%.6g",SUB84((double)den,0));
        }
        lVar7 = lVar7 + 2 + (long)iVar3;
      }
      *(undefined1 *)((long)&local_68.d.d + lVar7) = 0x5d;
      sVar5 = strlen((char *)pQVar10);
      memcpy((void *)((long)&local_68.d.d + lVar7 + 1),pQVar10,sVar5);
      sVar5 = strlen((char *)pQVar10);
      size = sVar5 + lVar7 + 1;
      pQVar10 = &local_68;
    }
  }
  else {
    pQVar10 = &local_68;
    local_68.d.d._0_4_ =
         CONCAT31(0x73,den != 10 &&
                       (den == 100 ||
                       (den == 1000000000000000000 ||
                       den != 1000000000000000 &&
                       (den != 1000000000000 &&
                       (den != 1000000000 && (den == 1000000 || den == 1000))))));
    uVar2 = local_68.d.d._0_4_;
    local_68.d.d._3_1_ = SUB41(uVar1,3);
    local_68.d.d._0_3_ = (uint3)(ushort)uVar2;
    size = 2;
  }
  QByteArray::QByteArray(&local_80,(char *)pQVar10,size);
LAB_00223e94:
  ::QTextStream::operator<<(&this_00->ts,&local_80);
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putTimeUnit(qint64 num, qint64 den)
{
    stream->ts << timeUnit(num, den); // ### optimize
}